

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::DtlsSession::SetClientTransportId(Error *__return_storage_ptr__,DtlsSession *this)

{
  ErrorCode EVar1;
  int aMbedtlsError;
  Error *pEVar2;
  char *begin;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Address peerAddr;
  string local_98;
  undefined1 local_78 [8];
  char *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  parse_func local_50 [1];
  undefined1 local_48 [40];
  
  if ((this->mIsServer != true) || (this->mIsClientIdSet == true)) {
    abort();
  }
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  (*(this->super_Endpoint)._vptr_Endpoint[3])(&peerAddr,this);
  if (peerAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      peerAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_78._0_4_ = none_type;
    local_70 = "has no valid peer address";
    local_68 = 0x19;
    local_60._M_allocated_capacity = 0;
    local_50[0] = (parse_func)0x0;
    pcVar3 = "has no valid peer address";
    local_60._8_8_ = (format_string_checker<char> *)local_78;
    while (begin = pcVar3, begin != "") {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_78);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_98,(v10 *)"has no valid peer address",(string_view)ZEXT816(0x19),args);
    local_48._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_98);
    Error::operator=(__return_storage_ptr__,(Error *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    aMbedtlsError =
         mbedtls_ssl_set_client_transport_id
                   (&this->mSsl,
                    peerAddr.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)peerAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)peerAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    ErrorFromMbedtlsError((Error *)local_78,aMbedtlsError);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_78);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)&local_70);
    if (EVar1 == kNone) {
      this->mIsClientIdSet = true;
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&peerAddr);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::SetClientTransportId()
{
    VerifyOrDie(mIsServer && !mIsClientIdSet);

    Error error;
    int   fail;
    auto  peerAddr = GetPeerAddr();

    VerifyOrExit(peerAddr.IsValid(), error = ERROR_INVALID_STATE("has no valid peer address"));

    fail = mbedtls_ssl_set_client_transport_id(&mSsl, reinterpret_cast<const uint8_t *>(peerAddr.GetRaw().data()),
                                               peerAddr.GetRaw().size());
    SuccessOrExit(error = ErrorFromMbedtlsError(fail));

    mIsClientIdSet = true;

exit:
    return error;
}